

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arbitrary.cpp
# Opt level: O0

void __thiscall Arbitrarywchar_t::~Arbitrarywchar_t(Arbitrarywchar_t *this)

{
  Arbitrarywchar_t *this_local;
  
  ~Arbitrarywchar_t(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

DEF_TEST(wchar_t, Arbitrary)
{
  testinator::Arbitrary<wchar_t> a;
  wchar_t v = a.generate(0,0);
  a.shrink(v);
  return true;
}